

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  byte *pbVar5;
  mz_uint8 (*pamVar6) [288];
  long lVar7;
  mz_uint16 (*pamVar8) [288];
  int iVar9;
  long lVar10;
  mz_uint16 *pmVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong *puVar22;
  mz_uint mVar23;
  mz_uint8 *pmVar24;
  mz_uint8 *pmVar25;
  byte bVar26;
  uint uVar27;
  byte *pbVar28;
  byte bVar29;
  bool bVar30;
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar9 = 0x11f;
    lVar10 = 0x9067;
    do {
      if (lVar10 - 0x8f49U < 0x102) {
        iVar9 = 0x101;
        break;
      }
      iVar9 = iVar9 + -1;
      lVar7 = lVar10 + -0x14;
      lVar10 = lVar10 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar7) == '\0');
    iVar13 = 0x1f;
    lVar10 = 36999;
    do {
      if (lVar10 - 0x9069U < 2) {
        iVar13 = 1;
        break;
      }
      iVar13 = iVar13 + -1;
      lVar7 = lVar10 + -0x14;
      lVar10 = lVar10 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar7) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar9);
    memcpy(local_178 + iVar9,d->m_huff_code_sizes + 1,(long)iVar13);
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0xe) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x16) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1e) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x24) = 0;
    if (iVar13 + iVar9 == 0) {
      uVar27 = 0;
    }
    else {
      pamVar8 = d->m_huff_count + 2;
      pmVar1 = d->m_huff_count[2] + 0x12;
      pmVar2 = d->m_huff_count[2] + 0x11;
      uVar19 = 0;
      uVar27 = 0;
      uVar16 = 0;
      uVar14 = 0;
      uVar21 = 0xff;
      do {
        bVar26 = local_178[uVar19];
        uVar18 = (ulong)bVar26;
        bVar29 = (byte)uVar21;
        if (uVar18 == 0) {
          if (uVar14 != 0) {
            if (uVar14 < 3) {
              (*pamVar8)[uVar21] = (*pamVar8)[uVar21] + (short)uVar14;
              uVar12 = uVar27;
              do {
                uVar27 = uVar12 + 1;
                abStack_2b8[uVar12] = bVar29;
                uVar14 = uVar14 - 1;
                uVar12 = uVar27;
              } while (uVar14 != 0);
            }
            else {
              pmVar11 = d->m_huff_count[2] + 0x10;
              *pmVar11 = *pmVar11 + 1;
              uVar12 = uVar27 + 1;
              abStack_2b8[uVar27] = 0x10;
              uVar27 = uVar27 + 2;
              abStack_2b8[uVar12] = (char)uVar14 - 3;
            }
          }
          uVar16 = uVar16 + 1;
          if (uVar16 == 0x8a) {
            *pmVar1 = *pmVar1 + 1;
            abStack_2b8[uVar27] = 0x12;
            abStack_2b8[uVar27 + 1] = 0x7f;
LAB_0010d2ca:
            uVar27 = uVar27 + 2;
            uVar14 = 0;
            goto LAB_0010d2cd;
          }
          uVar14 = 0;
        }
        else {
          if (uVar16 != 0) {
            if (uVar16 < 3) {
              (*pamVar8)[0] = (*pamVar8)[0] + (short)uVar16;
              uVar12 = uVar27;
              do {
                uVar27 = uVar12 + 1;
                abStack_2b8[uVar12] = 0;
                uVar16 = uVar16 - 1;
                uVar12 = uVar27;
              } while (uVar16 != 0);
            }
            else {
              bVar30 = uVar16 < 0xb;
              pmVar11 = pmVar1;
              if (bVar30) {
                pmVar11 = pmVar2;
              }
              *pmVar11 = *pmVar11 + 1;
              abStack_2b8[uVar27] = 0x12 - bVar30;
              abStack_2b8[uVar27 + 1] = (bVar30 * '\b' + (char)uVar16) - 0xb;
              uVar27 = uVar27 + 2;
            }
          }
          if (bVar26 == bVar29) {
            uVar14 = uVar14 + 1;
            if (uVar14 == 6) {
              pmVar11 = d->m_huff_count[2] + 0x10;
              *pmVar11 = *pmVar11 + 1;
              abStack_2b8[uVar27] = 0x10;
              abStack_2b8[uVar27 + 1] = 3;
              goto LAB_0010d2ca;
            }
LAB_0010d2cd:
            uVar16 = 0;
          }
          else {
            if (uVar14 != 0) {
              if (uVar14 < 3) {
                (*pamVar8)[uVar21] = (*pamVar8)[uVar21] + (short)uVar14;
                uVar16 = uVar27;
                do {
                  uVar27 = uVar16 + 1;
                  abStack_2b8[uVar16] = bVar29;
                  uVar14 = uVar14 - 1;
                  uVar16 = uVar27;
                } while (uVar14 != 0);
              }
              else {
                pmVar11 = d->m_huff_count[2] + 0x10;
                *pmVar11 = *pmVar11 + 1;
                uVar16 = uVar27 + 1;
                abStack_2b8[uVar27] = 0x10;
                uVar27 = uVar27 + 2;
                abStack_2b8[uVar16] = (char)uVar14 - 3;
              }
            }
            uVar21 = (ulong)uVar27;
            (*pamVar8)[uVar18] = (*pamVar8)[uVar18] + 1;
            uVar27 = uVar27 + 1;
            abStack_2b8[uVar21] = bVar26;
            uVar14 = 0;
            uVar16 = 0;
          }
        }
        uVar19 = uVar19 + 1;
        uVar21 = uVar18;
      } while (uVar19 != (uint)(iVar13 + iVar9));
      if (uVar14 == 0) {
        if (uVar16 != 0) {
          if (uVar16 < 3) {
            (*pamVar8)[0] = (*pamVar8)[0] + (short)uVar16;
            uVar14 = uVar27;
            do {
              uVar27 = uVar14 + 1;
              abStack_2b8[uVar14] = 0;
              uVar16 = uVar16 - 1;
              uVar14 = uVar27;
            } while (uVar16 != 0);
          }
          else {
            if (uVar16 < 0xb) {
              *pmVar2 = *pmVar2 + 1;
              abStack_2b8[uVar27] = 0x11;
              bVar26 = (char)uVar16 - 3;
            }
            else {
              *pmVar1 = *pmVar1 + 1;
              abStack_2b8[uVar27] = 0x12;
              bVar26 = (char)uVar16 - 0xb;
            }
            abStack_2b8[uVar27 + 1] = bVar26;
            uVar27 = uVar27 + 2;
          }
        }
      }
      else if (uVar14 < 3) {
        (*pamVar8)[uVar18] = (*pamVar8)[uVar18] + (short)uVar14;
        uVar16 = uVar27;
        do {
          uVar27 = uVar16 + 1;
          abStack_2b8[uVar16] = bVar26;
          uVar14 = uVar14 - 1;
          uVar16 = uVar27;
        } while (uVar14 != 0);
      }
      else {
        pmVar1 = d->m_huff_count[2] + 0x10;
        *pmVar1 = *pmVar1 + 1;
        uVar16 = uVar27 + 1;
        abStack_2b8[uVar27] = 0x10;
        uVar27 = uVar27 + 2;
        abStack_2b8[uVar16] = (char)uVar14 - 3;
      }
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    mVar23 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = mVar23;
    uVar14 = d->m_bits_in + 2;
    d->m_bits_in = uVar14;
    while (7 < uVar14) {
      pmVar25 = d->m_pOutput_buf;
      if (pmVar25 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar25 + 1;
        *pmVar25 = (mz_uint8)mVar23;
        uVar14 = d->m_bits_in;
        mVar23 = d->m_bit_buffer;
      }
      mVar23 = mVar23 >> 8;
      d->m_bit_buffer = mVar23;
      uVar14 = uVar14 - 8;
      d->m_bits_in = uVar14;
    }
    if (0x1f < iVar9 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                    ,0x3f1,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar23 = iVar9 - 0x101U << ((byte)uVar14 & 0x1f) | mVar23;
    d->m_bit_buffer = mVar23;
    uVar16 = uVar14 + 5;
    d->m_bits_in = uVar16;
    if (2 < uVar14) {
      do {
        pmVar25 = d->m_pOutput_buf;
        if (pmVar25 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar25 + 1;
          *pmVar25 = (mz_uint8)mVar23;
          uVar16 = d->m_bits_in;
          mVar23 = d->m_bit_buffer;
        }
        mVar23 = mVar23 >> 8;
        d->m_bit_buffer = mVar23;
        uVar16 = uVar16 - 8;
        d->m_bits_in = uVar16;
      } while (7 < uVar16);
    }
    if (0x1f < iVar13 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                    ,0x3f2,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    uVar14 = iVar13 - 1U << ((byte)uVar16 & 0x1f) | mVar23;
    d->m_bit_buffer = uVar14;
    uVar12 = uVar16 + 5;
    d->m_bits_in = uVar12;
    if (2 < uVar16) {
      do {
        pmVar25 = d->m_pOutput_buf;
        if (pmVar25 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar25 + 1;
          *pmVar25 = (mz_uint8)uVar14;
          uVar12 = d->m_bits_in;
          uVar14 = d->m_bit_buffer;
        }
        uVar14 = uVar14 >> 8;
        d->m_bit_buffer = uVar14;
        uVar12 = uVar12 - 8;
        d->m_bits_in = uVar12;
      } while (7 < uVar12);
    }
    uVar16 = 0x12;
    do {
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar16]] != '\0') goto LAB_0010d4fd;
      bVar30 = uVar16 != 0;
      uVar16 = uVar16 - 1;
    } while (bVar30);
    uVar16 = 0xffffffff;
LAB_0010d4fd:
    uVar20 = 3;
    if (3 < (int)uVar16) {
      uVar20 = uVar16;
    }
    if (0xf < uVar20 - 3) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                    ,0x3f8,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar23 = uVar20 - 3 << ((byte)uVar12 & 0x1f) | uVar14;
    d->m_bit_buffer = mVar23;
    uVar14 = uVar12 + 4;
    d->m_bits_in = uVar14;
    if (3 < uVar12) {
      do {
        pmVar25 = d->m_pOutput_buf;
        if (pmVar25 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar25 + 1;
          *pmVar25 = (mz_uint8)mVar23;
          uVar14 = d->m_bits_in;
          mVar23 = d->m_bit_buffer;
        }
        mVar23 = mVar23 >> 8;
        d->m_bit_buffer = mVar23;
        uVar14 = uVar14 - 8;
        d->m_bits_in = uVar14;
      } while (7 < uVar14);
    }
    uVar21 = 0;
    do {
      uVar16 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar21]];
      if (7 < uVar16) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                      ,0x3fa,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      mVar23 = mVar23 | uVar16 << ((byte)uVar14 & 0x1f);
      d->m_bit_buffer = mVar23;
      uVar14 = uVar14 + 3;
      d->m_bits_in = uVar14;
      while (7 < uVar14) {
        pmVar25 = d->m_pOutput_buf;
        if (pmVar25 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar25 + 1;
          *pmVar25 = (mz_uint8)mVar23;
          uVar14 = d->m_bits_in;
          mVar23 = d->m_bit_buffer;
        }
        mVar23 = mVar23 >> 8;
        d->m_bit_buffer = mVar23;
        uVar14 = uVar14 - 8;
        d->m_bits_in = uVar14;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar20 + 1);
    if (uVar27 != 0) {
      uVar16 = 0;
      do {
        bVar26 = abStack_2b8[uVar16];
        uVar21 = (ulong)bVar26;
        if (0x12 < uVar21) {
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                        ,0x3ff,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar4 = d->m_huff_codes[2][uVar21];
        bVar29 = d->m_huff_code_sizes[2][uVar21];
        if (uVar4 >> (bVar29 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                        ,0x400,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        mVar23 = (uint)uVar4 << ((byte)uVar14 & 0x1f) | mVar23;
        d->m_bit_buffer = mVar23;
        uVar14 = bVar29 + uVar14;
        d->m_bits_in = uVar14;
        while (7 < uVar14) {
          pmVar25 = d->m_pOutput_buf;
          if (pmVar25 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar25 + 1;
            *pmVar25 = (mz_uint8)mVar23;
            uVar14 = d->m_bits_in;
            mVar23 = d->m_bit_buffer;
          }
          mVar23 = mVar23 >> 8;
          d->m_bit_buffer = mVar23;
          uVar14 = uVar14 - 8;
          d->m_bits_in = uVar14;
        }
        uVar12 = uVar16 + 1;
        if (0xf < bVar26) {
          bVar26 = "\x02\x03\a"[bVar26 - 0x10];
          if (abStack_2b8[(ulong)uVar16 + 1] >> (bVar26 & 0x1f) != 0) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                          ,0x402,"void tdefl_start_dynamic_block(tdefl_compressor *)");
          }
          mVar23 = (uint)abStack_2b8[(ulong)uVar16 + 1] << ((byte)uVar14 & 0x1f) | mVar23;
          d->m_bit_buffer = mVar23;
          uVar14 = (int)(char)bVar26 + uVar14;
          d->m_bits_in = uVar14;
          while (uVar12 = uVar16 + 2, 7 < uVar14) {
            pmVar25 = d->m_pOutput_buf;
            if (pmVar25 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar25 + 1;
              *pmVar25 = (mz_uint8)mVar23;
              uVar14 = d->m_bits_in;
              mVar23 = d->m_bit_buffer;
            }
            mVar23 = mVar23 >> 8;
            d->m_bit_buffer = mVar23;
            uVar14 = uVar14 - 8;
            d->m_bits_in = uVar14;
          }
        }
        uVar16 = uVar12;
      } while (uVar16 < uVar27);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xf) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x17) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    mVar23 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = mVar23;
    uVar14 = d->m_bits_in + 2;
    d->m_bits_in = uVar14;
    while (7 < uVar14) {
      pmVar25 = d->m_pOutput_buf;
      if (pmVar25 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar25 + 1;
        *pmVar25 = (mz_uint8)mVar23;
        uVar14 = d->m_bits_in;
        mVar23 = d->m_bit_buffer;
      }
      mVar23 = mVar23 >> 8;
      d->m_bit_buffer = mVar23;
      uVar14 = uVar14 - 8;
      d->m_bits_in = uVar14;
    }
  }
  pbVar5 = d->m_pLZ_code_buf;
  puVar22 = (ulong *)d->m_pOutput_buf;
  uVar21 = (ulong)mVar23;
  pmVar25 = d->m_lz_code_buf;
  if (pmVar25 < pbVar5) {
    uVar27 = 1;
    do {
      pmVar24 = pmVar25;
      if (uVar27 == 1) {
        pmVar24 = pmVar25 + 1;
        uVar27 = *pmVar25 | 0x100;
      }
      uVar16 = uVar27;
      if ((uVar27 & 1) == 0) {
        bVar26 = d->m_huff_code_sizes[0][*pmVar24];
        if (bVar26 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                        ,0x44d,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar25 = pmVar24 + 1;
        uVar21 = (ulong)d->m_huff_codes[0][*pmVar24] << ((byte)uVar14 & 0x3f) | uVar21;
        uVar14 = bVar26 + uVar14;
        if (((uVar27 & 2) == 0) && (pmVar25 < pbVar5)) {
          bVar26 = d->m_huff_code_sizes[0][pmVar24[1]];
          if (bVar26 == 0) {
            __assert_fail("d->m_huff_code_sizes[0][lit]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                          ,0x454,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
          }
          pmVar25 = pmVar24 + 2;
          uVar16 = uVar27 >> 1;
          uVar21 = uVar21 | (ulong)d->m_huff_codes[0][pmVar24[1]] << ((byte)uVar14 & 0x3f);
          uVar14 = uVar14 + bVar26;
          if (((uVar27 & 4) == 0) && (pmVar25 < pbVar5)) {
            bVar26 = *pmVar25;
            bVar29 = d->m_huff_code_sizes[0][bVar26];
            if (bVar29 == 0) {
              __assert_fail("d->m_huff_code_sizes[0][lit]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                            ,0x45b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
            }
            pmVar25 = pmVar24 + 3;
            uVar21 = uVar21 | (ulong)d->m_huff_codes[0][bVar26] << ((byte)uVar14 & 0x3f);
            uVar14 = uVar14 + bVar29;
            uVar16 = uVar27 >> 2;
          }
        }
      }
      else {
        bVar26 = *pmVar24;
        bVar29 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar26]];
        if (bVar29 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                        ,0x43a,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        uVar4 = *(ushort *)(pmVar24 + 1);
        pbVar15 = "" + (uVar4 >> 8);
        if (uVar4 < 0x200) {
          pbVar15 = "" + (uVar4 & 0x1ff);
        }
        bVar3 = d->m_huff_code_sizes[1][*pbVar15];
        if (bVar3 == 0) {
          __assert_fail("d->m_huff_code_sizes[1][sym]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                        ,0x446,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar25 = pmVar24 + 3;
        pbVar28 = "" + (uVar4 & 0x1ff);
        if (0x1ff < uVar4) {
          pbVar28 = "" + (uVar4 >> 8);
        }
        iVar17 = bVar29 + uVar14;
        iVar13 = iVar17 + (uint)""[bVar26];
        iVar9 = (uint)bVar3 + iVar13;
        uVar21 = (ulong)((uint)uVar4 & mz_bitmasks[*pbVar28]) << ((byte)iVar9 & 0x3f) |
                 (ulong)d->m_huff_codes[1][*pbVar15] << ((byte)iVar13 & 0x3f) |
                 (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar26]] << ((byte)uVar14 & 0x3f) |
                 (ulong)((uint)bVar26 & mz_bitmasks[""[bVar26]]) << ((byte)iVar17 & 0x3f) | uVar21;
        uVar14 = iVar9 + (uint)*pbVar28;
      }
      if (d->m_pOutput_buf_end <= puVar22) {
        return 0;
      }
      *puVar22 = uVar21;
      puVar22 = (ulong *)((long)puVar22 + (ulong)(uVar14 >> 3));
      uVar21 = uVar21 >> ((byte)uVar14 & 0x38);
      uVar14 = uVar14 & 7;
      uVar27 = uVar16 >> 1;
    } while (pmVar25 < pbVar5);
  }
  d->m_pOutput_buf = (mz_uint8 *)puVar22;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;
  if (uVar14 == 0) {
    mVar23 = 0;
    uVar27 = 0;
  }
  else {
    mVar23 = 0;
    uVar27 = 0;
    do {
      uVar19 = 0x10;
      if (uVar14 < 0x10) {
        uVar19 = (ulong)uVar14;
      }
      uVar16 = mz_bitmasks[uVar19] & (uint)uVar21;
      if (uVar16 >> ((byte)uVar19 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                      ,0x473,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      mVar23 = uVar16 << ((byte)uVar27 & 0x1f) | mVar23;
      d->m_bit_buffer = mVar23;
      uVar27 = uVar27 + (int)uVar19;
      d->m_bits_in = uVar27;
      while (7 < uVar27) {
        pmVar25 = d->m_pOutput_buf;
        if (pmVar25 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar25 + 1;
          *pmVar25 = (mz_uint8)mVar23;
          uVar27 = d->m_bits_in;
          mVar23 = d->m_bit_buffer;
        }
        mVar23 = mVar23 >> 8;
        d->m_bit_buffer = mVar23;
        uVar27 = uVar27 - 8;
        d->m_bits_in = uVar27;
      }
      uVar21 = uVar21 >> ((byte)uVar19 & 0x3f);
      uVar14 = uVar14 - (int)uVar19;
    } while (uVar14 != 0);
  }
  uVar4 = d->m_huff_codes[0][0x100];
  bVar26 = d->m_huff_code_sizes[0][0x100];
  if (uVar4 >> (bVar26 & 0x1f) == 0) {
    uVar14 = (uint)uVar4 << ((byte)uVar27 & 0x1f) | mVar23;
    d->m_bit_buffer = uVar14;
    uVar27 = bVar26 + uVar27;
    d->m_bits_in = uVar27;
    while (7 < uVar27) {
      pmVar25 = d->m_pOutput_buf;
      if (pmVar25 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar25 + 1;
        *pmVar25 = (mz_uint8)uVar14;
        uVar27 = d->m_bits_in;
        uVar14 = d->m_bit_buffer;
      }
      uVar14 = uVar14 >> 8;
      d->m_bit_buffer = uVar14;
      uVar27 = uVar27 - 8;
      d->m_bits_in = uVar27;
    }
    return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                ,0x478,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block)
{
    if (static_block)
        tdefl_start_static_block(d);
    else
        tdefl_start_dynamic_block(d);
    return tdefl_compress_lz_codes(d);
}